

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O3

void __thiscall
QTextDocumentPrivate::setCharFormat
          (QTextDocumentPrivate *this,int pos,int length,QTextCharFormat *newFormat,
          FormatChangeMode mode)

{
  FragmentMap *this_00;
  QTextFormatCollection *this_01;
  int iVar1;
  QTextFragmentData *pQVar2;
  QTextLayout *pQVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint k;
  long in_FS_OFFSET;
  int local_c0;
  undefined1 local_78 [16];
  int local_68;
  undefined4 uStack_64;
  Data *pDStack_60;
  undefined1 local_58 [16];
  totally_ordered_wrapper<QTextFormatPrivate_*> local_48;
  uint uStack_40;
  undefined4 uStack_3c;
  QExplicitlySharedDataPointer<QFontPrivate> local_38;
  
  local_38.d.ptr = *(totally_ordered_wrapper<QFontPrivate_*> *)(in_FS_OFFSET + 0x28);
  iVar5 = this->editBlock;
  this->editBlock = iVar5 + 1;
  if (iVar5 == 0) {
    this->revision = this->revision + 1;
  }
  if (mode == SetFormatAndPreserveObjectIndices) {
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTextFormat::QTextFormat((QTextFormat *)local_78,&newFormat->super_QTextFormat);
    QTextFormat::clearProperty((QTextFormat *)local_78,0);
    local_c0 = QTextFormatCollection::indexForFormat(&this->formats,(QTextFormat *)local_78);
    QTextFormat::~QTextFormat((QTextFormat *)local_78);
  }
  else {
    local_c0 = -1;
    if (mode == SetFormat) {
      local_c0 = QTextFormatCollection::indexForFormat(&this->formats,&newFormat->super_QTextFormat)
      ;
    }
  }
  if (pos != -1) goto LAB_004d2867;
  if (mode == MergeFormat) {
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTextFormatCollection::format((QTextFormatCollection *)local_78,(int)&this->formats);
    QTextFormat::merge((QTextFormat *)local_78,&newFormat->super_QTextFormat);
    iVar5 = QTextFormatCollection::indexForFormat(&this->formats,(QTextFormat *)local_78);
    this->initialBlockCharFormatIndex = iVar5;
    QTextFormat::~QTextFormat((QTextFormat *)local_78);
  }
  else {
    if (mode == SetFormatAndPreserveObjectIndices) {
      iVar7 = (int)&this->formats;
      QTextFormatCollection::format((QTextFormatCollection *)local_78,iVar7);
      iVar5 = QTextFormat::objectIndex((QTextFormat *)local_78);
      QTextFormat::~QTextFormat((QTextFormat *)local_78);
      if (iVar5 != -1) {
        local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QTextFormat::QTextFormat((QTextFormat *)local_78,&newFormat->super_QTextFormat);
        QTextFormatCollection::format((QTextFormatCollection *)&stack0xffffffffffffffb8,iVar7);
        iVar5 = QTextFormat::objectIndex((QTextFormat *)&stack0xffffffffffffffb8);
        QTextFormat::setObjectIndex((QTextFormat *)local_78,iVar5);
        QTextFormat::~QTextFormat((QTextFormat *)&stack0xffffffffffffffb8);
        iVar5 = QTextFormatCollection::indexForFormat(&this->formats,(QTextFormat *)local_78);
        this->initialBlockCharFormatIndex = iVar5;
        QTextFormat::~QTextFormat((QTextFormat *)local_78);
        goto LAB_004d2861;
      }
    }
    this->initialBlockCharFormatIndex = local_c0;
  }
LAB_004d2861:
  length = length + -1;
  pos = 0;
LAB_004d2867:
  iVar5 = pos + length;
  split(this,pos);
  split(this,iVar5);
  if (0 < length) {
    this_00 = &this->fragments;
    this_01 = &this->formats;
    k = pos;
    do {
      local_48.ptr = (QTextFormatPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      uStack_40 = 0xaaaaaaaa;
      uStack_3c = 0xaaaaaaaa;
      uVar6 = QFragmentMapData<QTextFragmentData>::findNode(&this_00->data,k,0);
      _uStack_40 = (QTextFormat *)CONCAT44(uStack_3c,uVar6);
      pQVar2 = (this_00->data).field_0.fragments;
      local_48.ptr = (QTextFormatPrivate *)this_00;
      iVar7 = QFragmentMap<QTextFragmentData>::Iterator::position
                        ((Iterator *)&stack0xffffffffffffffb8);
      iVar7 = (iVar7 - k) + pQVar2[uVar6].super_QFragment<1>.size_array[0];
      if ((int)(iVar5 - k) < iVar7) {
        iVar7 = iVar5 - k;
      }
      iVar1 = pQVar2[uVar6].format;
      iVar9 = (int)this_01;
      if (mode == MergeFormat) {
        local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QTextFormatCollection::format((QTextFormatCollection *)local_78,iVar9);
        QTextFormat::merge((QTextFormat *)local_78,&newFormat->super_QTextFormat);
        iVar9 = QTextFormatCollection::indexForFormat(this_01,(QTextFormat *)local_78);
        pQVar2[uVar6].format = iVar9;
        QTextFormat::~QTextFormat((QTextFormat *)local_78);
      }
      else {
        if (mode == SetFormatAndPreserveObjectIndices) {
          QTextFormatCollection::format((QTextFormatCollection *)local_78,iVar9);
          iVar8 = QTextFormat::objectIndex((QTextFormat *)local_78);
          QTextFormat::~QTextFormat((QTextFormat *)local_78);
          if (iVar8 != -1) {
            local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            QTextFormat::QTextFormat((QTextFormat *)local_78,&newFormat->super_QTextFormat);
            QTextFormatCollection::format((QTextFormatCollection *)local_58,iVar9);
            iVar9 = QTextFormat::objectIndex((QTextFormat *)local_58);
            QTextFormat::setObjectIndex((QTextFormat *)local_78,iVar9);
            QTextFormat::~QTextFormat((QTextFormat *)local_58);
            iVar9 = QTextFormatCollection::indexForFormat(this_01,(QTextFormat *)local_78);
            pQVar2[uVar6].format = iVar9;
            QTextFormat::~QTextFormat((QTextFormat *)local_78);
            goto LAB_004d2a33;
          }
        }
        pQVar2[uVar6].format = local_c0;
      }
LAB_004d2a33:
      local_78._4_4_ = iVar1;
      local_78._0_4_ = 0x1010002;
      local_78._8_8_ = (ulong)k << 0x20;
      _local_68 = CONCAT44(0xaaaaaaaa,iVar7);
      pDStack_60 = (Data *)0xaaaaaaaa00000000;
      appendUndoItem(this,(QTextUndoCommand *)local_78);
      k = k + iVar7;
    } while ((int)k < iVar5);
  }
  uVar6 = QFragmentMapData<QTextFragmentData>::findNode(&(this->fragments).data,pos - 1,0);
  if (uVar6 != 0) {
    unite(this,uVar6);
  }
  uVar6 = QFragmentMapData<QTextFragmentData>::findNode(&(this->fragments).data,iVar5,0);
  if (uVar6 != 0) {
    unite(this,uVar6);
  }
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  uVar6 = QFragmentMapData<QTextBlockData>::findNode(&(this->blocks).data,pos,0);
  local_78._8_4_ = uVar6;
  _uStack_40 = (QTextFormat *)&DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = this;
  uVar6 = QFragmentMapData<QTextBlockData>::findNode(&(this->blocks).data,iVar5,0);
  local_48.ptr = (QTextFormatPrivate *)this;
  uStack_40 = uVar6;
  bVar4 = QTextBlock::isValid((QTextBlock *)&stack0xffffffffffffffb8);
  if (bVar4) {
    QTextBlock::next((QTextBlock *)local_58);
    local_48.ptr = (QTextFormatPrivate *)local_58._0_8_;
    uStack_40 = local_58._8_4_;
  }
  bVar4 = QTextBlock::isValid((QTextBlock *)local_78);
  if (bVar4) {
    do {
      if (((QTextFormatPrivate *)local_78._0_8_ == local_48.ptr) && (local_78._8_4_ == uStack_40))
      break;
      pQVar3 = (((BlockMap *)(local_78._0_8_ + 0x160))->data).field_0.fragments
               [local_78._8_8_ & 0xffffffff].layout;
      if (pQVar3 != (QTextLayout *)0x0) {
        QTextEngine::invalidate(pQVar3->d);
      }
      QTextBlock::next((QTextBlock *)local_58);
      local_78._0_8_ = local_58._0_8_;
      local_78._8_4_ = local_58._8_4_;
      bVar4 = QTextBlock::isValid((QTextBlock *)local_78);
    } while (bVar4);
  }
  documentChange(this,pos,length);
  endEditBlock(this);
  if ((totally_ordered_wrapper<QFontPrivate_*>)*(QFontPrivate **)(in_FS_OFFSET + 0x28) ==
      local_38.d.ptr) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocumentPrivate::setCharFormat(int pos, int length, const QTextCharFormat &newFormat, FormatChangeMode mode)
{
    beginEditBlock();

    Q_ASSERT(newFormat.isValid());

    int newFormatIdx = -1;
    if (mode == SetFormatAndPreserveObjectIndices) {
        QTextCharFormat cleanFormat = newFormat;
        cleanFormat.clearProperty(QTextFormat::ObjectIndex);
        newFormatIdx = formats.indexForFormat(cleanFormat);
    } else if (mode == SetFormat) {
        newFormatIdx = formats.indexForFormat(newFormat);
    }

    if (pos == -1) {
        if (mode == MergeFormat) {
            QTextFormat format = formats.format(initialBlockCharFormatIndex);
            format.merge(newFormat);
            initialBlockCharFormatIndex = formats.indexForFormat(format);
        } else if (mode == SetFormatAndPreserveObjectIndices
                   && formats.format(initialBlockCharFormatIndex).objectIndex() != -1) {
            QTextCharFormat f = newFormat;
            f.setObjectIndex(formats.format(initialBlockCharFormatIndex).objectIndex());
            initialBlockCharFormatIndex = formats.indexForFormat(f);
        } else {
            initialBlockCharFormatIndex = newFormatIdx;
        }

        ++pos;
        --length;
    }

    const int startPos = pos;
    const int endPos = pos + length;

    split(startPos);
    split(endPos);

    while (pos < endPos) {
        FragmentMap::Iterator it = fragments.find(pos);
        Q_ASSERT(!it.atEnd());

        QTextFragmentData *fragment = it.value();

        Q_ASSERT(formats.format(fragment->format).type() == QTextFormat::CharFormat);

        int offset = pos - it.position();
        int length = qMin(endPos - pos, int(fragment->size_array[0] - offset));
        int oldFormat = fragment->format;

        if (mode == MergeFormat) {
            QTextFormat format = formats.format(fragment->format);
            format.merge(newFormat);
            fragment->format = formats.indexForFormat(format);
        } else if (mode == SetFormatAndPreserveObjectIndices
                   && formats.format(oldFormat).objectIndex() != -1) {
            QTextCharFormat f = newFormat;
            f.setObjectIndex(formats.format(oldFormat).objectIndex());
            fragment->format = formats.indexForFormat(f);
        } else {
            fragment->format = newFormatIdx;
        }

        QT_INIT_TEXTUNDOCOMMAND(c, QTextUndoCommand::CharFormatChanged, true, QTextUndoCommand::MoveCursor, oldFormat,
                                0, pos, length, 0);
        appendUndoItem(c);

        pos += length;
        Q_ASSERT(q20::cmp_equal(pos, (it.position() + fragment->size_array[0])) || pos >= endPos);
    }

    int n = fragments.findNode(startPos - 1);
    if (n)
        unite(n);

    n = fragments.findNode(endPos);
    if (n)
        unite(n);

    QTextBlock blockIt = blocksFind(startPos);
    QTextBlock endIt = blocksFind(endPos);
    if (endIt.isValid())
        endIt = endIt.next();
    for (; blockIt.isValid() && blockIt != endIt; blockIt = blockIt.next())
        QTextDocumentPrivate::block(blockIt)->invalidate();

    documentChange(startPos, length);

    endEditBlock();
}